

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

void __thiscall cxxopts::Options::Options(Options *this,string *program,string *help_string)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  pointer pcVar4;
  undefined8 uVar5;
  
  paVar1 = &(this->m_program).field_2;
  (this->m_program)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (program->_M_dataplus)._M_p;
  paVar2 = &program->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar5 = *(undefined8 *)((long)&program->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_program).field_2 + 8) = uVar5;
  }
  else {
    (this->m_program)._M_dataplus._M_p = pcVar4;
    (this->m_program).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_program)._M_string_length = program->_M_string_length;
  (program->_M_dataplus)._M_p = (pointer)paVar2;
  program->_M_string_length = 0;
  (program->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->m_help_string).field_2;
  (this->m_help_string)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (help_string->_M_dataplus)._M_p;
  paVar2 = &help_string->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar5 = *(undefined8 *)((long)&help_string->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_help_string).field_2 + 8) = uVar5;
  }
  else {
    (this->m_help_string)._M_dataplus._M_p = pcVar4;
    (this->m_help_string).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_help_string)._M_string_length = help_string->_M_string_length;
  (help_string->_M_dataplus)._M_p = (pointer)paVar2;
  help_string->_M_string_length = 0;
  (help_string->field_2)._M_local_buf[0] = '\0';
  (this->m_positional_help)._M_dataplus._M_p = (pointer)&(this->m_positional_help).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->m_positional_help,"positional parameters","");
  p_Var3 = &(this->m_options)._M_t._M_impl.super__Rb_tree_header;
  (this->m_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->m_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->m_positional).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_positional).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_options)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_positional).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_next_positional)._M_current =
       (this->m_positional).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_positional_set)._M_h._M_buckets = &(this->m_positional_set)._M_h._M_single_bucket;
  (this->m_positional_set)._M_h._M_bucket_count = 1;
  (this->m_positional_set)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_positional_set)._M_h._M_element_count = 0;
  (this->m_positional_set)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_positional_set)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_positional_set)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var3 = &(this->m_help)._M_t._M_impl.super__Rb_tree_header;
  (this->m_help)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_help)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_help)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->m_help)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->m_help)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

Options(std::string program, std::string help_string = "")
    : m_program(std::move(program))
    , m_help_string(toLocalString(std::move(help_string)))
    , m_positional_help("positional parameters")
    , m_next_positional(m_positional.end())
    {
    }